

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O0

void set_results(double *results,int row,int p,int d,int q,int P,int D,int Q,int constant,double ic)

{
  int iVar1;
  int index;
  double ic_local;
  int P_local;
  int q_local;
  int d_local;
  int p_local;
  int row_local;
  double *results_local;
  
  iVar1 = (row + -1) * 8;
  results[iVar1] = (double)p;
  results[iVar1 + 1] = (double)d;
  results[iVar1 + 2] = (double)q;
  results[iVar1 + 3] = (double)P;
  results[iVar1 + 4] = (double)D;
  results[iVar1 + 5] = (double)Q;
  results[iVar1 + 6] = (double)constant;
  results[iVar1 + 7] = ic;
  return;
}

Assistant:

static void set_results(double *results, int row, int p, int d, int q, int P, int D, int Q, int constant, double ic) {
	int index;

	index = 8 * (row-1);

	results[index] = (double) p;
	results[index+1] = (double) d;
	results[index+2] = (double) q;
	results[index+3] = (double) P;
	results[index+4] = (double) D;
	results[index+5] = (double) Q;
	results[index+6] = (double) constant;
	results[index+7] = ic;
}